

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeRollback(Btree *p,int tripCode,int writeOnly)

{
  int iVar1;
  int rc2_1;
  int rc2;
  MemPage *pPage1;
  BtShared *pBt;
  int local_18;
  int rc;
  int writeOnly_local;
  int tripCode_local;
  Btree *p_local;
  
  pPage1 = (MemPage *)p->pBt;
  local_18 = writeOnly;
  rc = tripCode;
  _writeOnly_local = p;
  sqlite3BtreeEnter(p);
  if (rc == 0) {
    pBt._4_4_ = saveAllCursors((BtShared *)pPage1,0,(BtCursor *)0x0);
    rc = pBt._4_4_;
    if (pBt._4_4_ != 0) {
      local_18 = 0;
    }
  }
  else {
    pBt._4_4_ = 0;
  }
  if ((rc != 0) && (iVar1 = sqlite3BtreeTripAllCursors(_writeOnly_local,rc,local_18), iVar1 != 0)) {
    pBt._4_4_ = iVar1;
  }
  if (_writeOnly_local->inTrans == '\x02') {
    iVar1 = sqlite3PagerRollback(*(Pager **)pPage1);
    if (iVar1 != 0) {
      pBt._4_4_ = iVar1;
    }
    iVar1 = btreeGetPage((BtShared *)pPage1,1,(MemPage **)&rc2_1,0);
    if (iVar1 == 0) {
      btreeSetNPage((BtShared *)pPage1,_rc2_1);
      releasePageOne(_rc2_1);
    }
    pPage1->field_0x24 = 1;
    btreeClearHasContent((BtShared *)pPage1);
  }
  btreeEndTransaction(_writeOnly_local);
  sqlite3BtreeLeave(_writeOnly_local);
  return pBt._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeRollback(Btree *p, int tripCode, int writeOnly){
  int rc;
  BtShared *pBt = p->pBt;
  MemPage *pPage1;

  assert( writeOnly==1 || writeOnly==0 );
  assert( tripCode==SQLITE_ABORT_ROLLBACK || tripCode==SQLITE_OK );
  sqlite3BtreeEnter(p);
  if( tripCode==SQLITE_OK ){
    rc = tripCode = saveAllCursors(pBt, 0, 0);
    if( rc ) writeOnly = 0;
  }else{
    rc = SQLITE_OK;
  }
  if( tripCode ){
    int rc2 = sqlite3BtreeTripAllCursors(p, tripCode, writeOnly);
    assert( rc==SQLITE_OK || (writeOnly==0 && rc2==SQLITE_OK) );
    if( rc2!=SQLITE_OK ) rc = rc2;
  }
  btreeIntegrity(p);

  if( p->inTrans==TRANS_WRITE ){
    int rc2;

    assert( TRANS_WRITE==pBt->inTransaction );
    rc2 = sqlite3PagerRollback(pBt->pPager);
    if( rc2!=SQLITE_OK ){
      rc = rc2;
    }

    /* The rollback may have destroyed the pPage1->aData value.  So
    ** call btreeGetPage() on page 1 again to make
    ** sure pPage1->aData is set correctly. */
    if( btreeGetPage(pBt, 1, &pPage1, 0)==SQLITE_OK ){
      btreeSetNPage(pBt, pPage1);
      releasePageOne(pPage1);
    }
    assert( countValidCursors(pBt, 1)==0 );
    pBt->inTransaction = TRANS_READ;
    btreeClearHasContent(pBt);
  }

  btreeEndTransaction(p);
  sqlite3BtreeLeave(p);
  return rc;
}